

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::ChainPromiseNode> __thiscall
kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params)

{
  PromiseNode *pPVar1;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Own<kj::_::PromiseNode> local_28;
  
  pCVar2 = (ChainPromiseNode *)operator_new(0x50);
  local_28.disposer = params->disposer;
  local_28.ptr = params->ptr;
  params->ptr = (PromiseNode *)0x0;
  _::ChainPromiseNode::ChainPromiseNode(pCVar2,&local_28);
  pPVar1 = local_28.ptr;
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ChainPromiseNode>::instance;
  *(ChainPromiseNode **)(this + 8) = pCVar2;
  pCVar2 = extraout_RDX;
  if (local_28.ptr != (PromiseNode *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  OVar3.ptr = pCVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}